

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtectorChain.cpp
# Opt level: O3

void __thiscall CppUnit::ProtectorChain::pop(ProtectorChain *this)

{
  _Elt_pointer ppPVar1;
  
  ppPVar1 = (this->m_protectors).
            super__Deque_base<CppUnit::Protector_*,_std::allocator<CppUnit::Protector_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (ppPVar1 ==
      (this->m_protectors).
      super__Deque_base<CppUnit::Protector_*,_std::allocator<CppUnit::Protector_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppPVar1 = (this->m_protectors).
              super__Deque_base<CppUnit::Protector_*,_std::allocator<CppUnit::Protector_*>_>._M_impl
              .super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  if (ppPVar1[-1] != (Protector *)0x0) {
    (*ppPVar1[-1]->_vptr_Protector[1])();
  }
  std::deque<CppUnit::Protector_*,_std::allocator<CppUnit::Protector_*>_>::pop_back
            (&this->m_protectors);
  return;
}

Assistant:

void 
ProtectorChain::pop()
{
  delete m_protectors.back();
  m_protectors.pop_back();
}